

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerProfiledBinaryOp(Lowerer *this,JitProfilingInstr *instr,JnHelperMethod meth)

{
  Opnd *pOVar1;
  IntConstOpnd *opndArg;
  AddrOpnd *opndArg_00;
  HelperCallOpnd *newSrc;
  JnHelperMethod meth_local;
  JitProfilingInstr *instr_local;
  Lowerer *this_local;
  
  pOVar1 = IR::Instr::UnlinkSrc2(&instr->super_Instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,pOVar1);
  pOVar1 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,pOVar1);
  opndArg = IR::Opnd::CreateProfileIdOpnd(instr->profileId,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg->super_Opnd);
  opndArg_00 = CreateFunctionBodyOpnd(this,(instr->super_Instr).m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg_00->super_Opnd);
  newSrc = IR::HelperCallOpnd::New(meth,this->m_func);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledBinaryOp(IR::JitProfilingInstr* instr, IR::JnHelperMethod meth)
{
    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc2());
    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, m_func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(instr->m_func));
    instr->SetSrc1(IR::HelperCallOpnd::New(meth, m_func));
    m_lowererMD.LowerCall(instr, 0);
}